

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_NtkWritePis(FILE *pFile,Abc_Ntk_t *pNtk,int fWriteLatches)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  size_t sVar4;
  int local_40;
  int local_3c;
  int i;
  int NameCounter;
  int AddedLength;
  int LineLength;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pTerm;
  int fWriteLatches_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  NameCounter = 7;
  local_3c = 0;
  if (fWriteLatches == 0) {
    for (local_40 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_40 < iVar1; local_40 = local_40 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,local_40);
      pAVar2 = Abc_ObjFanout0(pAVar2);
      pcVar3 = Abc_ObjName(pAVar2);
      sVar4 = strlen(pcVar3);
      iVar1 = (int)sVar4 + 1;
      if ((local_3c != 0) && (0x4e < NameCounter + iVar1 + 3)) {
        fprintf((FILE *)pFile," \\\n");
        NameCounter = 0;
        local_3c = 0;
      }
      pcVar3 = Abc_ObjName(pAVar2);
      fprintf((FILE *)pFile," %s",pcVar3);
      NameCounter = iVar1 + NameCounter;
      local_3c = local_3c + 1;
    }
  }
  else {
    for (local_40 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_40 < iVar1; local_40 = local_40 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,local_40);
      pAVar2 = Abc_ObjFanout0(pAVar2);
      pcVar3 = Abc_ObjName(pAVar2);
      sVar4 = strlen(pcVar3);
      iVar1 = (int)sVar4 + 1;
      if ((local_3c != 0) && (0x4e < NameCounter + iVar1 + 3)) {
        fprintf((FILE *)pFile," \\\n");
        NameCounter = 0;
        local_3c = 0;
      }
      pcVar3 = Abc_ObjName(pAVar2);
      fprintf((FILE *)pFile," %s",pcVar3);
      NameCounter = iVar1 + NameCounter;
      local_3c = local_3c + 1;
    }
  }
  return;
}

Assistant:

void Io_NtkWritePis( FILE * pFile, Abc_Ntk_t * pNtk, int fWriteLatches )
{
    Abc_Obj_t * pTerm, * pNet;
    int LineLength;
    int AddedLength;
    int NameCounter;
    int i;

    LineLength  = 7;
    NameCounter = 0;

    if ( fWriteLatches )
    {
        Abc_NtkForEachPi( pNtk, pTerm, i )
        {
            pNet = Abc_ObjFanout0(pTerm);
            // get the line length after this name is written
            AddedLength = strlen(Abc_ObjName(pNet)) + 1;
            if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
            { // write the line extender
                fprintf( pFile, " \\\n" );
                // reset the line length
                LineLength  = 0;
                NameCounter = 0;
            }
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
            LineLength += AddedLength;
            NameCounter++;
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pTerm, i )
        {
            pNet = Abc_ObjFanout0(pTerm);
            // get the line length after this name is written
            AddedLength = strlen(Abc_ObjName(pNet)) + 1;
            if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
            { // write the line extender
                fprintf( pFile, " \\\n" );
                // reset the line length
                LineLength  = 0;
                NameCounter = 0;
            }
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
            LineLength += AddedLength;
            NameCounter++;
        }
    }
}